

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O0

Error asmjit::_abi_1_10::x86::InstInternal::validate
                (Arch arch,BaseInst *inst,Operand_ *operands,size_t opCount,
                ValidationFlags validationFlags)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  RegType RVar4;
  RegType RVar5;
  InstOptions IVar6;
  OperandType OVar7;
  Broadcast BVar8;
  int32_t iVar9;
  ValidationFlags VVar10;
  Error EVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  OpFlags OVar14;
  OpSignature *pOVar15;
  InstSignature *pIVar16;
  RegOnly *this;
  ulong in_RCX;
  long in_RDX;
  BaseInst *in_RSI;
  Arch in_DIL;
  ValidationFlags in_R8D;
  RegOnly *extraReg;
  OpSignature *oRef;
  OpSignature *oChk;
  uint32_t r;
  bool localImmOutOfRange;
  uint32_t iSigCount;
  uint32_t j;
  bool globalImmOutOfRange;
  OpSignature *opSignatureTable;
  InstSignature *iEnd;
  InstSignature *iSig;
  bool hasREX;
  OpSignature *oSigDst;
  uint64_t immValue;
  uint32_t indexId;
  int64_t offset;
  uint32_t baseId;
  RegType indexType;
  RegType baseType;
  uint32_t memSize;
  Mem *m;
  uint32_t regId;
  RegType regType;
  RegMask regMask;
  OpFlags opFlags;
  Operand_ *op;
  Mem *memOp;
  uint32_t combinedRegMask;
  OpFlags combinedOpFlags;
  OpSignature oSigTranslated [6];
  InstOptions kAvx512Options;
  InstOptions kXAcqXRel;
  InstOptions kRepAny;
  InstFlags iFlags;
  CommonInfo *commonInfo;
  InstInfo *instInfo;
  InstOptions options;
  InstId instId;
  Mode mode;
  uint32_t i;
  X86ValidationData *vd;
  char *in_stack_00000250;
  int in_stack_0000025c;
  char *in_stack_00000260;
  undefined4 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5c;
  byte bVar17;
  undefined1 in_stack_fffffffffffffe5d;
  undefined1 in_stack_fffffffffffffe5e;
  byte in_stack_fffffffffffffe5f;
  InstFlags in_stack_fffffffffffffe60;
  InstFlags in_stack_fffffffffffffe64;
  bool *in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe70;
  uint32_t in_stack_fffffffffffffe74;
  OpSignature *in_stack_fffffffffffffe78;
  bool local_17e;
  uint32_t local_178;
  bool local_172;
  bool local_171;
  byte local_161;
  byte local_160;
  byte local_15e;
  byte local_15d;
  uint local_13c;
  uint local_130;
  undefined1 *local_128;
  InstSignature *local_118;
  unsigned_long local_100;
  uint32_t local_f4;
  long local_f0;
  uint32_t local_e4;
  RegType local_de;
  RegType local_dd;
  uint32_t local_dc;
  Mem *local_d8;
  uint32_t local_cc;
  RegType local_c5;
  uint32_t local_c4;
  OpFlags local_c0;
  Operand_ *local_b8;
  Mem *local_b0;
  uint local_a4;
  OpFlags local_a0;
  OpSignature local_98 [7];
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  InstFlags local_54;
  CommonInfo *local_50;
  InstInfo *local_48;
  InstFlags local_40;
  InstId local_3c;
  Mode local_35;
  uint local_34;
  undefined1 *local_30;
  ValidationFlags local_24;
  ulong local_20;
  long local_18;
  BaseInst *local_10;
  Arch local_5;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_5 = in_DIL;
  bVar2 = Environment::isFamilyX86(in_DIL);
  if (!bVar2) {
    DebugUtils::assertionFailed(in_stack_00000260,in_stack_0000025c,in_stack_00000250);
  }
  if (local_5 == k32BitMask) {
    local_30 = _x86ValidationData;
  }
  else {
    local_30 = _x64ValidationData;
  }
  local_35 = InstDB::modeFromArch(local_5);
  local_3c = BaseInst::id(local_10);
  local_40 = BaseInst::options(local_10);
  bVar2 = Inst::isDefinedId(local_3c);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    EVar11 = DebugUtils::errored(0x1a);
    return EVar11;
  }
  local_48 = InstDB::infoById(0);
  local_50 = InstDB::InstInfo::commonInfo(local_48);
  local_54 = InstDB::InstInfo::flags((InstInfo *)0x191c1c);
  local_58 = 0xc000;
  local_5c = 0x30000;
  local_60 = 0x8c0000;
  _abi_1_10::operator|(kX86_Lock,kX86_XRelease|kX86_XAcquire);
  bVar2 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                    (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
  if (bVar2) {
    bVar2 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                      (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
    if (bVar2) {
      bVar2 = Support::
              test<asmjit::_abi_1_10::x86::InstDB::InstFlags,asmjit::_abi_1_10::x86::InstDB::InstFlags>
                        (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
      local_15d = 0;
      if (!bVar2) {
        bVar2 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                          (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
        local_15d = bVar2 ^ 0xff;
      }
      if ((local_15d & 1) != 0) {
        EVar11 = DebugUtils::errored(0x21);
        return EVar11;
      }
      local_15e = 1;
      if (local_20 != 0) {
        bVar2 = Operand_::isMem((Operand_ *)0x191d03);
        local_15e = bVar2 ^ 0xff;
      }
      if ((local_15e & 1) != 0) {
        EVar11 = DebugUtils::errored(0x21);
        return EVar11;
      }
    }
    bVar2 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                      (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
    if (bVar2) {
      bVar3 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                        (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
      bVar2 = true;
      if (bVar3) {
        IVar6 = _abi_1_10::operator&(local_40,kX86_XRelease|kX86_XAcquire);
        bVar2 = IVar6 == (kX86_XRelease|kX86_XAcquire);
      }
      if (bVar2) {
        EVar11 = DebugUtils::errored(0x20);
        return EVar11;
      }
      bVar2 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                        (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
      local_160 = 0;
      if (bVar2) {
        bVar2 = Support::
                test<asmjit::_abi_1_10::x86::InstDB::InstFlags,asmjit::_abi_1_10::x86::InstDB::InstFlags>
                          (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
        local_160 = bVar2 ^ 0xff;
      }
      if ((local_160 & 1) != 0) {
        EVar11 = DebugUtils::errored(0x22);
        return EVar11;
      }
      bVar2 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                        (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
      local_161 = 0;
      if (bVar2) {
        bVar2 = Support::
                test<asmjit::_abi_1_10::x86::InstDB::InstFlags,asmjit::_abi_1_10::x86::InstDB::InstFlags>
                          (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
        local_161 = bVar2 ^ 0xff;
      }
      if ((local_161 & 1) != 0) {
        EVar11 = DebugUtils::errored(0x23);
        return EVar11;
      }
    }
  }
  bVar2 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                    (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
  if (bVar2) {
    IVar6 = _abi_1_10::operator&(local_40,kX86_Repne|kX86_Rep);
    if (IVar6 == (kX86_Repne|kX86_Rep)) {
      EVar11 = DebugUtils::errored(0x20);
      return EVar11;
    }
    bVar2 = Support::
            test<asmjit::_abi_1_10::x86::InstDB::InstFlags,asmjit::_abi_1_10::x86::InstDB::InstFlags>
                      (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      EVar11 = DebugUtils::errored(0x24);
      return EVar11;
    }
  }
  local_a0 = kNone;
  local_a4 = 0;
  local_b0 = (Mem *)0x0;
  for (local_34 = 0; local_34 < local_20; local_34 = local_34 + 1) {
    local_b8 = (Operand_ *)(local_18 + (ulong)local_34 * 0x10);
    OVar7 = Operand_::opType((Operand_ *)0x191f57);
    if (OVar7 == kNone) break;
    local_c0 = kNone;
    local_c4 = 0;
    OVar7 = Operand_::opType((Operand_ *)0x191f7f);
    switch(OVar7) {
    case kReg:
      Operand_::as<asmjit::_abi_1_10::BaseReg>(local_b8);
      local_c5 = BaseReg::type((BaseReg *)0x191fbb);
      local_c0 = *(OpFlags *)(_x86OpFlagFromRegType + (ulong)local_c5 * 8);
      if (local_c0 == kNone) {
        EVar11 = DebugUtils::errored(0x1b);
        return EVar11;
      }
      local_cc = Operand_::id(local_b8);
      if (local_cc < 0x100) {
        if (0x1f < local_cc) {
          EVar11 = DebugUtils::errored(0x1d);
          return EVar11;
        }
        bVar2 = Support::bitTest<unsigned_int,unsigned_int>
                          (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
        if (!bVar2) {
          EVar11 = DebugUtils::errored(0x1d);
          return EVar11;
        }
        local_c4 = Support::bitMask<unsigned_int>((uint *)0x1920b2);
        local_a4 = local_c4 | local_a4;
      }
      else {
        VVar10 = _abi_1_10::operator&(local_24,kEnableVirtRegs);
        if (VVar10 == kNone) {
          EVar11 = DebugUtils::errored(0x3e);
          return EVar11;
        }
        local_c4 = 0xffffffff;
      }
      break;
    case kMem:
      local_d8 = Operand_::as<asmjit::_abi_1_10::x86::Mem>(local_b8);
      local_b0 = local_d8;
      local_dc = Operand_::size((Operand_ *)0x19213e);
      local_dd = BaseMem::baseType((BaseMem *)0x192152);
      local_de = BaseMem::indexType((BaseMem *)0x192166);
      uVar13 = Mem::segmentId((Mem *)0x19217a);
      if (6 < uVar13) {
        EVar11 = DebugUtils::errored(0x31);
        return EVar11;
      }
      bVar2 = Mem::hasBroadcast((Mem *)0x1921a2);
      if (bVar2) {
        if (local_dc == 0) {
          bVar2 = InstDB::CommonInfo::hasAvx512B64((CommonInfo *)0x192266);
          if (bVar2) {
            local_178 = 8;
          }
          else {
            bVar2 = InstDB::CommonInfo::hasAvx512B32((CommonInfo *)0x192284);
            local_178 = 2;
            if (bVar2) {
              local_178 = 4;
            }
          }
          local_dc = local_178;
        }
        else {
          local_171 = InstDB::CommonInfo::hasAvx512B32((CommonInfo *)0x1921c6);
          local_171 = local_171 && local_dc != 4;
          if (local_171) {
            EVar11 = DebugUtils::errored(0x29);
            return EVar11;
          }
          local_172 = InstDB::CommonInfo::hasAvx512B64((CommonInfo *)0x192215);
          local_172 = local_172 && local_dc != 8;
          if (local_172) {
            EVar11 = DebugUtils::errored(0x29);
            return EVar11;
          }
        }
        BVar8 = Mem::getBroadcast((Mem *)0x1922b2);
        local_dc = local_dc << ((byte)BVar8 & 0x1f);
      }
      if ((local_dd == kNone) || (bVar2 = operator>(local_dd,kLabelTag), !bVar2)) {
        if (local_dd != kLabelTag) {
          local_f0 = BaseMem::offset((BaseMem *)
                                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          bVar2 = Support::isInt32<long>
                            (CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
          if (!bVar2) {
            if (local_35 == kX86) {
              bVar2 = Support::isUInt32<long>(local_f0);
              if (!bVar2) {
                EVar11 = DebugUtils::errored(0x2e);
                return EVar11;
              }
            }
            else if (local_de != kNone) {
              bVar2 = Support::isUInt32<long>(local_f0);
              if (!bVar2) {
                EVar11 = DebugUtils::errored(0x2e);
                return EVar11;
              }
              if (local_de != kARM_GpW) {
                EVar11 = DebugUtils::errored(0x2f);
                return EVar11;
              }
            }
          }
        }
      }
      else {
        local_e4 = BaseMem::baseId(&local_d8->super_BaseMem);
        bVar2 = BaseMem::isRegHome((BaseMem *)0x19230e);
        if ((!bVar2) &&
           (bVar2 = Support::bitTest<unsigned_int,asmjit::_abi_1_10::RegType>
                              (in_stack_fffffffffffffe64,
                               (RegType)(in_stack_fffffffffffffe60 >> 0x18)),
           ((bVar2 ^ 0xffU) & 1) != 0)) {
          EVar11 = DebugUtils::errored(0x2b);
          return EVar11;
        }
        if (local_e4 < 0x100) {
          if (0x1f < local_e4) {
            EVar11 = DebugUtils::errored(0x1d);
            return EVar11;
          }
          local_c4 = Support::bitMask<unsigned_int>((uint *)0x19239a);
          local_a4 = local_c4 | local_a4;
        }
        else {
          VVar10 = _abi_1_10::operator&(local_24,kEnableVirtRegs);
          if (VVar10 == kNone) {
            EVar11 = DebugUtils::errored(0x3e);
            return EVar11;
          }
          local_c4 = 0xffffffff;
        }
        if ((local_de == kNone) &&
           (iVar9 = BaseMem::offsetLo32(&local_d8->super_BaseMem), iVar9 == 0)) {
          InstDB::operator|=(&local_c0,kFlagMemBase);
        }
      }
      if (local_de != kNone) {
        bVar2 = Support::bitTest<unsigned_int,asmjit::_abi_1_10::RegType>
                          (in_stack_fffffffffffffe64,(RegType)(in_stack_fffffffffffffe60 >> 0x18));
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          EVar11 = DebugUtils::errored(0x2b);
          return EVar11;
        }
        if (local_de == kARM_VecV) {
          OVar14 = InstDB::operator|(kVm32x,kVm64x);
          InstDB::operator|=(&local_c0,OVar14);
        }
        else if (local_de == kVec256) {
          OVar14 = InstDB::operator|(kVm32y,kVm64y);
          InstDB::operator|=(&local_c0,OVar14);
        }
        else if (local_de == kVec512) {
          OVar14 = InstDB::operator|(kVm32z,kVm64z);
          InstDB::operator|=(&local_c0,OVar14);
        }
        else if (local_dd != kNone) {
          InstDB::operator|=(&local_c0,kFlagMib);
        }
        if ((local_dd == kARM_PC) &&
           (bVar2 = Support::
                    test<asmjit::_abi_1_10::x86::InstDB::OpFlags,asmjit::_abi_1_10::x86::InstDB::OpFlags>
                              (CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                               CONCAT17(in_stack_fffffffffffffe5f,
                                        CONCAT16(in_stack_fffffffffffffe5e,
                                                 CONCAT15(in_stack_fffffffffffffe5d,
                                                          CONCAT14(in_stack_fffffffffffffe5c,
                                                                   in_stack_fffffffffffffe58))))),
           bVar2)) {
          EVar11 = DebugUtils::errored(0x2b);
          return EVar11;
        }
        local_f4 = BaseMem::indexId(&local_d8->super_BaseMem);
        if (local_f4 < 0x100) {
          if (0x1f < local_f4) {
            EVar11 = DebugUtils::errored(0x1d);
            return EVar11;
          }
          uVar13 = Support::bitMask<unsigned_int>((uint *)0x192690);
          local_a4 = uVar13 | local_a4;
        }
        else {
          VVar10 = _abi_1_10::operator&(local_24,kEnableVirtRegs);
          if (VVar10 == kNone) {
            EVar11 = DebugUtils::errored(0x3e);
            return EVar11;
          }
        }
        local_c4 = 0;
      }
      if (local_dc == 0) {
        InstDB::operator|=(&local_c0,kMemUnspecified);
      }
      else if (local_dc == 1) {
        InstDB::operator|=(&local_c0,kMem8);
      }
      else if (local_dc == 2) {
        InstDB::operator|=(&local_c0,kMem16);
      }
      else if (local_dc == 4) {
        InstDB::operator|=(&local_c0,kMem32);
      }
      else if (local_dc == 6) {
        InstDB::operator|=(&local_c0,kMem48);
      }
      else if (local_dc == 8) {
        InstDB::operator|=(&local_c0,kMem64);
      }
      else if (local_dc == 10) {
        InstDB::operator|=(&local_c0,kMem80);
      }
      else if (local_dc == 0x10) {
        InstDB::operator|=(&local_c0,kMem128);
      }
      else if (local_dc == 0x20) {
        InstDB::operator|=(&local_c0,kMem256);
      }
      else {
        if (local_dc != 0x40) {
          EVar11 = DebugUtils::errored(0x33);
          return EVar11;
        }
        InstDB::operator|=(&local_c0,kMem512);
      }
      break;
    case kImm:
      Operand_::as<asmjit::_abi_1_10::Imm>(local_b8);
      local_100 = Imm::valueAs<unsigned_long>((Imm *)0x19287c);
      if ((long)local_100 < 0) {
        local_100 = Support::neg<unsigned_long>(&local_100);
        if (local_100 < 9) {
          OVar14 = InstDB::operator|(kImmI64,kImmI32);
          OVar14 = InstDB::operator|(OVar14,kImmI16);
          OVar14 = InstDB::operator|(OVar14,kImmI8);
          local_c0 = InstDB::operator|(OVar14,kImmI4);
        }
        else if (local_100 < 0x81) {
          OVar14 = InstDB::operator|(kImmI64,kImmI32);
          OVar14 = InstDB::operator|(OVar14,kImmI16);
          local_c0 = InstDB::operator|(OVar14,kImmI8);
        }
        else if (local_100 < 0x8001) {
          OVar14 = InstDB::operator|(kImmI64,kImmI32);
          local_c0 = InstDB::operator|(OVar14,kImmI16);
        }
        else if (local_100 < 0x80000001) {
          local_c0 = InstDB::operator|(kImmI64,kImmI32);
        }
        else {
          local_c0 = kImmI64;
        }
      }
      else if (local_100 < 8) {
        OVar14 = InstDB::operator|(kImmI64,kImmU64);
        OVar14 = InstDB::operator|(OVar14,kImmI32);
        OVar14 = InstDB::operator|(OVar14,kImmU32);
        OVar14 = InstDB::operator|(OVar14,kImmI16);
        OVar14 = InstDB::operator|(OVar14,kImmU16);
        OVar14 = InstDB::operator|(OVar14,kImmI8);
        OVar14 = InstDB::operator|(OVar14,kImmU8);
        OVar14 = InstDB::operator|(OVar14,kImmI4);
        local_c0 = InstDB::operator|(OVar14,kImmU4);
      }
      else if (local_100 < 0x10) {
        OVar14 = InstDB::operator|(kImmI64,kImmU64);
        OVar14 = InstDB::operator|(OVar14,kImmI32);
        OVar14 = InstDB::operator|(OVar14,kImmU32);
        OVar14 = InstDB::operator|(OVar14,kImmI16);
        OVar14 = InstDB::operator|(OVar14,kImmU16);
        OVar14 = InstDB::operator|(OVar14,kImmI8);
        OVar14 = InstDB::operator|(OVar14,kImmU8);
        local_c0 = InstDB::operator|(OVar14,kImmU4);
      }
      else if (local_100 < 0x80) {
        OVar14 = InstDB::operator|(kImmI64,kImmU64);
        OVar14 = InstDB::operator|(OVar14,kImmI32);
        OVar14 = InstDB::operator|(OVar14,kImmU32);
        OVar14 = InstDB::operator|(OVar14,kImmI16);
        OVar14 = InstDB::operator|(OVar14,kImmU16);
        OVar14 = InstDB::operator|(OVar14,kImmI8);
        local_c0 = InstDB::operator|(OVar14,kImmU8);
      }
      else if (local_100 < 0x100) {
        OVar14 = InstDB::operator|(kImmI64,kImmU64);
        OVar14 = InstDB::operator|(OVar14,kImmI32);
        OVar14 = InstDB::operator|(OVar14,kImmU32);
        OVar14 = InstDB::operator|(OVar14,kImmI16);
        OVar14 = InstDB::operator|(OVar14,kImmU16);
        local_c0 = InstDB::operator|(OVar14,kImmU8);
      }
      else if (local_100 < 0x8000) {
        OVar14 = InstDB::operator|(kImmI64,kImmU64);
        OVar14 = InstDB::operator|(OVar14,kImmI32);
        OVar14 = InstDB::operator|(OVar14,kImmU32);
        OVar14 = InstDB::operator|(OVar14,kImmI16);
        local_c0 = InstDB::operator|(OVar14,kImmU16);
      }
      else if (local_100 < 0x10000) {
        OVar14 = InstDB::operator|(kImmI64,kImmU64);
        OVar14 = InstDB::operator|(OVar14,kImmI32);
        OVar14 = InstDB::operator|(OVar14,kImmU32);
        local_c0 = InstDB::operator|(OVar14,kImmU16);
      }
      else if (local_100 < 0x80000000) {
        OVar14 = InstDB::operator|(kImmI64,kImmU64);
        OVar14 = InstDB::operator|(OVar14,kImmI32);
        local_c0 = InstDB::operator|(OVar14,kImmU32);
      }
      else if (local_100 < 0x100000000) {
        OVar14 = InstDB::operator|(kImmI64,kImmU64);
        local_c0 = InstDB::operator|(OVar14,kImmU32);
      }
      else if (local_100 < 0x8000000000000000) {
        local_c0 = InstDB::operator|(kImmI64,kImmU64);
      }
      else {
        local_c0 = kImmU64;
      }
      break;
    case kLabel:
      OVar14 = InstDB::operator|(kRel8,kRel32);
      InstDB::operator|=(&local_c0,OVar14);
      break;
    default:
      EVar11 = DebugUtils::errored(3);
      return EVar11;
    }
    pOVar15 = local_98 + local_34;
    *pOVar15 = (OpSignature)((ulong)*pOVar15 & 0xff00000000000000 | local_c0 & 0xffffffffffffff);
    *pOVar15 = (OpSignature)((ulong)*pOVar15 & 0xffffffffffffff | (ulong)(local_c4 & 0xff) << 0x38);
    InstDB::operator|=(&local_a0,local_c0);
  }
  if (local_34 < local_20) {
    while (local_20 = local_20 - 1, local_34 < local_20) {
      bVar2 = Operand_::isNone((Operand_ *)
                               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        EVar11 = DebugUtils::errored(0x1a);
        return EVar11;
      }
    }
  }
  if (local_35 == kX86) {
    bVar2 = Support::
            test<asmjit::_abi_1_10::x86::InstDB::OpFlags,asmjit::_abi_1_10::x86::InstDB::OpFlags>
                      (CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       CONCAT17(in_stack_fffffffffffffe5f,
                                CONCAT16(in_stack_fffffffffffffe5e,
                                         CONCAT15(in_stack_fffffffffffffe5d,
                                                  CONCAT14(in_stack_fffffffffffffe5c,
                                                           in_stack_fffffffffffffe58)))));
    if (bVar2) {
      EVar11 = DebugUtils::errored(0x3a);
      return EVar11;
    }
  }
  else {
    bVar2 = BaseInst::hasOption((BaseInst *)
                                CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                                CONCAT13(in_stack_fffffffffffffe5f,
                                         CONCAT12(in_stack_fffffffffffffe5e,
                                                  CONCAT11(in_stack_fffffffffffffe5d,
                                                           in_stack_fffffffffffffe5c))));
    local_17e = false;
    if (bVar2 || (local_a4 & 0xffffff00) != 0) {
      local_17e = Support::
                  test<asmjit::_abi_1_10::x86::InstDB::OpFlags,asmjit::_abi_1_10::x86::InstDB::OpFlags>
                            (CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                             CONCAT17(in_stack_fffffffffffffe5f,
                                      CONCAT16(in_stack_fffffffffffffe5e,
                                               CONCAT15(in_stack_fffffffffffffe5d,
                                                        CONCAT14(in_stack_fffffffffffffe5c,
                                                                 in_stack_fffffffffffffe58)))));
    }
    if (local_17e != false) {
      EVar11 = DebugUtils::errored(0x39);
      return EVar11;
    }
  }
  local_118 = (InstSignature *)
              (InstDB::_instSignatureTable +
              (long)(int)(*(uint *)&local_50->field_0x4 >> 0xb & 0x7ff) * 8);
  pIVar16 = local_118 + (int)(*(uint *)&local_50->field_0x4 >> 0x16 & 0x1f);
  if (local_118 != pIVar16) {
    local_128 = InstDB::_opSignatureTable;
    do {
      bVar2 = InstDB::InstSignature::supportsMode(local_118,local_35);
      if (bVar2) {
        local_130 = 0;
        uVar13 = InstDB::InstSignature::opCount(local_118);
        if (uVar13 == local_20) {
          for (local_130 = 0; local_130 < local_20; local_130 = local_130 + 1) {
            in_stack_fffffffffffffe78 = local_98 + local_130;
            InstDB::InstSignature::opSignature
                      ((InstSignature *)
                       CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       CONCAT17(in_stack_fffffffffffffe5f,
                                CONCAT16(in_stack_fffffffffffffe5e,
                                         CONCAT15(in_stack_fffffffffffffe5d,
                                                  CONCAT14(in_stack_fffffffffffffe5c,
                                                           in_stack_fffffffffffffe58)))));
            bVar2 = x86CheckOSig(in_stack_fffffffffffffe78,
                                 (OpSignature *)
                                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                 in_stack_fffffffffffffe68);
            if (!bVar2) break;
          }
        }
        else {
          in_stack_fffffffffffffe74 = uVar13;
          uVar12 = InstDB::InstSignature::implicitOpCount(local_118);
          if (in_stack_fffffffffffffe74 - uVar12 == local_20) {
            local_13c = 0;
            local_130 = 0;
            while( true ) {
              uVar1 = in_stack_fffffffffffffe70 & 0xffffff;
              if (local_130 < local_20) {
                uVar1 = CONCAT13(local_13c < uVar13,(int3)in_stack_fffffffffffffe70);
              }
              in_stack_fffffffffffffe70 = uVar1;
              if ((char)(in_stack_fffffffffffffe70 >> 0x18) == '\0') break;
              while( true ) {
                in_stack_fffffffffffffe68 = (bool *)local_128;
                InstDB::InstSignature::opSignatureIndex
                          ((InstSignature *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                           CONCAT17(in_stack_fffffffffffffe5f,
                                    CONCAT16(in_stack_fffffffffffffe5e,
                                             CONCAT15(in_stack_fffffffffffffe5d,
                                                      CONCAT14(in_stack_fffffffffffffe5c,
                                                               in_stack_fffffffffffffe58)))));
                bVar2 = InstDB::OpSignature::isImplicit((OpSignature *)0x1932ce);
                if (!bVar2) break;
                local_13c = local_13c + 1;
                if (uVar13 <= local_13c) goto LAB_00193324;
              }
              bVar2 = x86CheckOSig(in_stack_fffffffffffffe78,
                                   (OpSignature *)
                                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                   in_stack_fffffffffffffe68);
              if (!bVar2) break;
              local_130 = local_130 + 1;
              local_13c = local_13c + 1;
            }
          }
        }
LAB_00193324:
        if (local_130 == local_20) break;
      }
      local_118 = local_118 + 1;
    } while (local_118 != pIVar16);
    if (local_118 == pIVar16) {
      EVar11 = DebugUtils::errored(0x1a);
      return EVar11;
    }
  }
  this = BaseInst::extraReg(local_10);
  bVar2 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                    (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
  if (bVar2) {
    bVar2 = InstDB::CommonInfo::hasFlag
                      ((CommonInfo *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       CONCAT13(in_stack_fffffffffffffe5f,
                                CONCAT12(in_stack_fffffffffffffe5e,
                                         CONCAT11(in_stack_fffffffffffffe5d,
                                                  in_stack_fffffffffffffe5c))));
    if (bVar2) {
      bVar2 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                        (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
      if (bVar2) {
        bVar2 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                          (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
        in_stack_fffffffffffffe64 = in_stack_fffffffffffffe64 & 0xffffff;
        if (bVar2) {
          bVar2 = InstDB::CommonInfo::hasAvx512Z((CommonInfo *)0x193440);
          in_stack_fffffffffffffe64 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe64) ^ 0xff000000;
        }
        if ((in_stack_fffffffffffffe64 & kPreferEvex) != kNone) {
          EVar11 = DebugUtils::errored(0x28);
          return EVar11;
        }
      }
      in_stack_fffffffffffffe60 = local_40;
      _abi_1_10::operator|(kX86_SAE,kX86_ER);
      bVar2 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                        (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
      if (bVar2) {
        if (local_b0 != (Mem *)0x0) {
          EVar11 = DebugUtils::errored(0x2a);
          return EVar11;
        }
        bVar2 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                          (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
        if (bVar2) {
          bVar2 = InstDB::CommonInfo::hasAvx512ER((CommonInfo *)0x1934ea);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            EVar11 = DebugUtils::errored(0x2a);
            return EVar11;
          }
        }
        else {
          bVar2 = InstDB::CommonInfo::hasAvx512SAE((CommonInfo *)0x19351b);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            EVar11 = DebugUtils::errored(0x2a);
            return EVar11;
          }
        }
        bVar2 = InstDB::CommonInfo::hasAvx512B
                          ((CommonInfo *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        if (bVar2) {
          if (local_20 < 2) {
            DebugUtils::assertionFailed(in_stack_00000260,in_stack_0000025c,in_stack_00000250);
          }
          bVar2 = x86IsZmmOrM512((Operand_ *)
                                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          in_stack_fffffffffffffe5f = 0;
          if (!bVar2) {
            bVar2 = x86IsZmmOrM512((Operand_ *)
                                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
            in_stack_fffffffffffffe5f = bVar2 ^ 0xff;
          }
          if ((in_stack_fffffffffffffe5f & 1) != 0) {
            EVar11 = DebugUtils::errored(0x2a);
            return EVar11;
          }
        }
      }
    }
    else {
      bVar2 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                        (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
      if ((bVar2) ||
         (bVar2 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                            (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60), !bVar2)) {
        EVar11 = DebugUtils::errored(0x1a);
        return EVar11;
      }
    }
  }
  bVar2 = RegOnly::isReg((RegOnly *)0x193630);
  if (bVar2) {
    bVar2 = Support::test<asmjit::_abi_1_10::InstOptions,asmjit::_abi_1_10::InstOptions>
                      (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
    if (bVar2) {
      bVar2 = Support::
              test<asmjit::_abi_1_10::x86::InstDB::InstFlags,asmjit::_abi_1_10::x86::InstDB::InstFlags>
                        (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
      if (bVar2) {
        EVar11 = DebugUtils::errored(0x26);
        return EVar11;
      }
      bVar2 = RegOnly::isPhysReg(this);
      if ((bVar2) && (uVar13 = RegOnly::id(this), uVar13 != 1)) {
        EVar11 = DebugUtils::errored(0x26);
        return EVar11;
      }
      bVar2 = true;
      if (local_b0 != (Mem *)0x0) {
        RVar5 = RegOnly::type((RegOnly *)0x1936e1);
        RVar4 = BaseMem::baseType((BaseMem *)0x1936f2);
        bVar2 = RVar5 != RVar4;
      }
      if (bVar2) {
        EVar11 = DebugUtils::errored(0x26);
        return EVar11;
      }
    }
    else {
      bVar2 = InstDB::CommonInfo::hasFlag
                        ((CommonInfo *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                         ,CONCAT13(in_stack_fffffffffffffe5f,
                                   CONCAT12(in_stack_fffffffffffffe5e,
                                            CONCAT11(in_stack_fffffffffffffe5d,
                                                     in_stack_fffffffffffffe5c))));
      if (!bVar2) {
        EVar11 = DebugUtils::errored(0x26);
        return EVar11;
      }
      RVar5 = RegOnly::type((RegOnly *)0x19374c);
      if (RVar5 != kMask) {
        EVar11 = DebugUtils::errored(0x26);
        return EVar11;
      }
      uVar13 = RegOnly::id(this);
      bVar17 = 1;
      if (uVar13 != 0) {
        bVar2 = InstDB::CommonInfo::hasAvx512K((CommonInfo *)0x193792);
        bVar17 = bVar2 ^ 0xff;
      }
      if ((bVar17 & 1) != 0) {
        EVar11 = DebugUtils::errored(0x27);
        return EVar11;
      }
    }
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error InstInternal::validate(Arch arch, const BaseInst& inst, const Operand_* operands, size_t opCount, ValidationFlags validationFlags) noexcept {
  // Only called when `arch` matches X86 family.
  ASMJIT_ASSERT(Environment::isFamilyX86(arch));

  const X86ValidationData* vd;
  if (arch == Arch::kX86)
    vd = &_x86ValidationData;
  else
    vd = &_x64ValidationData;

  uint32_t i;
  InstDB::Mode mode = InstDB::modeFromArch(arch);

  // Get the instruction data.
  InstId instId = inst.id();
  InstOptions options = inst.options();

  if (ASMJIT_UNLIKELY(!Inst::isDefinedId(instId)))
    return DebugUtils::errored(kErrorInvalidInstruction);

  const InstDB::InstInfo& instInfo = InstDB::infoById(instId);
  const InstDB::CommonInfo& commonInfo = instInfo.commonInfo();

  InstDB::InstFlags iFlags = instInfo.flags();

  constexpr InstOptions kRepAny = InstOptions::kX86_Rep | InstOptions::kX86_Repne;
  constexpr InstOptions kXAcqXRel = InstOptions::kX86_XAcquire | InstOptions::kX86_XRelease;
  constexpr InstOptions kAvx512Options = InstOptions::kX86_ZMask | InstOptions::kX86_ER | InstOptions::kX86_SAE;

  // Validate LOCK|XACQUIRE|XRELEASE Prefixes
  // ----------------------------------------

  if (Support::test(options, InstOptions::kX86_Lock | kXAcqXRel)) {
    if (Support::test(options, InstOptions::kX86_Lock)) {
      if (ASMJIT_UNLIKELY(!Support::test(iFlags, InstDB::InstFlags::kLock) && !Support::test(options, kXAcqXRel)))
        return DebugUtils::errored(kErrorInvalidLockPrefix);

      if (ASMJIT_UNLIKELY(opCount < 1 || !operands[0].isMem()))
        return DebugUtils::errored(kErrorInvalidLockPrefix);
    }

    if (Support::test(options, kXAcqXRel)) {
      if (ASMJIT_UNLIKELY(!Support::test(options, InstOptions::kX86_Lock) || (options & kXAcqXRel) == kXAcqXRel))
        return DebugUtils::errored(kErrorInvalidPrefixCombination);

      if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_XAcquire) && !Support::test(iFlags, InstDB::InstFlags::kXAcquire)))
        return DebugUtils::errored(kErrorInvalidXAcquirePrefix);

      if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_XRelease) && !Support::test(iFlags, InstDB::InstFlags::kXRelease)))
        return DebugUtils::errored(kErrorInvalidXReleasePrefix);
    }
  }

  // Validate REP and REPNE Prefixes
  // -------------------------------

  if (Support::test(options, kRepAny)) {
    if (ASMJIT_UNLIKELY((options & kRepAny) == kRepAny))
      return DebugUtils::errored(kErrorInvalidPrefixCombination);

    if (ASMJIT_UNLIKELY(!Support::test(iFlags, InstDB::InstFlags::kRep)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);
  }

  // Translate Each Operand to the Corresponding OpSignature
  // -------------------------------------------------------

  InstDB::OpSignature oSigTranslated[Globals::kMaxOpCount];
  InstDB::OpFlags combinedOpFlags = InstDB::OpFlags::kNone;
  uint32_t combinedRegMask = 0;
  const Mem* memOp = nullptr;

  for (i = 0; i < opCount; i++) {
    const Operand_& op = operands[i];
    if (op.opType() == OperandType::kNone)
      break;

    InstDB::OpFlags opFlags = InstDB::OpFlags::kNone;
    RegMask regMask = 0;

    switch (op.opType()) {
      case OperandType::kReg: {
        RegType regType = op.as<BaseReg>().type();
        opFlags = _x86OpFlagFromRegType[size_t(regType)];

        if (ASMJIT_UNLIKELY(opFlags == InstDB::OpFlags::kNone))
          return DebugUtils::errored(kErrorInvalidRegType);

        // If `regId` is equal or greater than Operand::kVirtIdMin it means that the register is virtual and its
        // index will be assigned later by the register allocator. We must pass unless asked to disallow virtual
        // registers.
        uint32_t regId = op.id();
        if (regId < Operand::kVirtIdMin) {
          if (ASMJIT_UNLIKELY(regId >= 32))
            return DebugUtils::errored(kErrorInvalidPhysId);

          if (ASMJIT_UNLIKELY(Support::bitTest(vd->allowedRegMask[size_t(regType)], regId) == 0))
            return DebugUtils::errored(kErrorInvalidPhysId);

          regMask = Support::bitMask(regId);
          combinedRegMask |= regMask;
        }
        else {
          if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
            return DebugUtils::errored(kErrorIllegalVirtReg);
          regMask = 0xFFFFFFFFu;
        }
        break;
      }

      // TODO: Validate base and index and combine these with `combinedRegMask`.
      case OperandType::kMem: {
        const Mem& m = op.as<Mem>();
        memOp = &m;

        uint32_t memSize = m.size();
        RegType baseType = m.baseType();
        RegType indexType = m.indexType();

        if (m.segmentId() > 6)
          return DebugUtils::errored(kErrorInvalidSegment);

        // Validate AVX-512 broadcast {1tox}.
        if (m.hasBroadcast()) {
          if (memSize != 0) {
            // If the size is specified it has to match the broadcast size.
            if (ASMJIT_UNLIKELY(commonInfo.hasAvx512B32() && memSize != 4))
              return DebugUtils::errored(kErrorInvalidBroadcast);

            if (ASMJIT_UNLIKELY(commonInfo.hasAvx512B64() && memSize != 8))
              return DebugUtils::errored(kErrorInvalidBroadcast);
          }
          else {
            // If there is no size we implicitly calculate it so we can validate N in {1toN} properly.
            memSize = commonInfo.hasAvx512B64() ? 8 :
                      commonInfo.hasAvx512B32() ? 4 : 2;
          }

          memSize <<= uint32_t(m.getBroadcast());
        }

        if (baseType != RegType::kNone && baseType > RegType::kLabelTag) {
          uint32_t baseId = m.baseId();

          if (m.isRegHome()) {
            // Home address of a virtual register. In such case we don't want to validate the type of the
            // base register as it will always be patched to ESP|RSP.
          }
          else {
            if (ASMJIT_UNLIKELY(!Support::bitTest(vd->allowedMemBaseRegs, baseType)))
              return DebugUtils::errored(kErrorInvalidAddress);
          }

          // Create information that will be validated only if this is an implicit memory operand. Basically
          // only usable for string instructions and other instructions where memory operand is implicit and
          // has 'seg:[reg]' form.
          if (baseId < Operand::kVirtIdMin) {
            if (ASMJIT_UNLIKELY(baseId >= 32))
              return DebugUtils::errored(kErrorInvalidPhysId);

            // Physical base id.
            regMask = Support::bitMask(baseId);
            combinedRegMask |= regMask;
          }
          else {
            // Virtual base id - fill the whole mask for implicit mem validation. The register is not assigned
            // yet, so we cannot predict the phys id.
            if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
              return DebugUtils::errored(kErrorIllegalVirtReg);
            regMask = 0xFFFFFFFFu;
          }

          if (indexType == RegType::kNone && !m.offsetLo32())
            opFlags |= InstDB::OpFlags::kFlagMemBase;
        }
        else if (baseType == RegType::kLabelTag) {
          // [Label] - there is no need to validate the base as it's label.
        }
        else {
          // Base is a 64-bit address.
          int64_t offset = m.offset();
          if (!Support::isInt32(offset)) {
            if (mode == InstDB::Mode::kX86) {
              // 32-bit mode: Make sure that the address is either `int32_t` or `uint32_t`.
              if (!Support::isUInt32(offset))
                return DebugUtils::errored(kErrorInvalidAddress64Bit);
            }
            else {
              // 64-bit mode: Zero extension is allowed if the address has 32-bit index register or the address
              // has no index register (it's still encodable).
              if (indexType != RegType::kNone) {
                if (!Support::isUInt32(offset))
                  return DebugUtils::errored(kErrorInvalidAddress64Bit);

                if (indexType != RegType::kX86_Gpd)
                  return DebugUtils::errored(kErrorInvalidAddress64BitZeroExtension);
              }
              else {
                // We don't validate absolute 64-bit addresses without an index register as this also depends
                // on the target's base address. We don't have the information to do it at this moment.
              }
            }
          }
        }

        if (indexType != RegType::kNone) {
          if (ASMJIT_UNLIKELY(!Support::bitTest(vd->allowedMemIndexRegs, indexType)))
            return DebugUtils::errored(kErrorInvalidAddress);

          if (indexType == RegType::kX86_Xmm) {
            opFlags |= InstDB::OpFlags::kVm32x | InstDB::OpFlags::kVm64x;
          }
          else if (indexType == RegType::kX86_Ymm) {
            opFlags |= InstDB::OpFlags::kVm32y | InstDB::OpFlags::kVm64y;
          }
          else if (indexType == RegType::kX86_Zmm) {
            opFlags |= InstDB::OpFlags::kVm32z | InstDB::OpFlags::kVm64z;
          }
          else {
            if (baseType != RegType::kNone)
              opFlags |= InstDB::OpFlags::kFlagMib;
          }

          // [RIP + {XMM|YMM|ZMM}] is not allowed.
          if (baseType == RegType::kX86_Rip && Support::test(opFlags, InstDB::OpFlags::kVmMask))
            return DebugUtils::errored(kErrorInvalidAddress);

          uint32_t indexId = m.indexId();
          if (indexId < Operand::kVirtIdMin) {
            if (ASMJIT_UNLIKELY(indexId >= 32))
              return DebugUtils::errored(kErrorInvalidPhysId);

            combinedRegMask |= Support::bitMask(indexId);
          }
          else {
            if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
              return DebugUtils::errored(kErrorIllegalVirtReg);
          }

          // Only used for implicit memory operands having 'seg:[reg]' form, so clear it.
          regMask = 0;
        }

        switch (memSize) {
          case  0: opFlags |= InstDB::OpFlags::kMemUnspecified; break;
          case  1: opFlags |= InstDB::OpFlags::kMem8; break;
          case  2: opFlags |= InstDB::OpFlags::kMem16; break;
          case  4: opFlags |= InstDB::OpFlags::kMem32; break;
          case  6: opFlags |= InstDB::OpFlags::kMem48; break;
          case  8: opFlags |= InstDB::OpFlags::kMem64; break;
          case 10: opFlags |= InstDB::OpFlags::kMem80; break;
          case 16: opFlags |= InstDB::OpFlags::kMem128; break;
          case 32: opFlags |= InstDB::OpFlags::kMem256; break;
          case 64: opFlags |= InstDB::OpFlags::kMem512; break;

          default:
            return DebugUtils::errored(kErrorInvalidOperandSize);
        }

        break;
      }

      case OperandType::kImm: {
        uint64_t immValue = op.as<Imm>().valueAs<uint64_t>();

        if (int64_t(immValue) >= 0) {
          if (immValue <= 0x7u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  |
                      InstDB::OpFlags::kImmI4  | InstDB::OpFlags::kImmU4  ;
          else if (immValue <= 0xFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  |
                      InstDB::OpFlags::kImmU4  ;
          else if (immValue <= 0x7Fu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  ;
          else if (immValue <= 0xFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmU8  ;
          else if (immValue <= 0x7FFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 ;
          else if (immValue <= 0xFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmU16 ;
          else if (immValue <= 0x7FFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32;
          else if (immValue <= 0xFFFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmU32;
          else if (immValue <= 0x7FFFFFFFFFFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64;
          else
            opFlags = InstDB::OpFlags::kImmU64;
        }
        else {
          immValue = Support::neg(immValue);
          if (immValue <= 0x8u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmI8 | InstDB::OpFlags::kImmI4;
          else if (immValue <= 0x80u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmI8;
          else if (immValue <= 0x8000u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16;
          else if (immValue <= 0x80000000u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32;
          else
            opFlags = InstDB::OpFlags::kImmI64;
        }
        break;
      }

      case OperandType::kLabel: {
        opFlags |= InstDB::OpFlags::kRel8 | InstDB::OpFlags::kRel32;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    InstDB::OpSignature& oSigDst = oSigTranslated[i];
    oSigDst._flags = uint64_t(opFlags) & 0x00FFFFFFFFFFFFFFu;
    oSigDst._regMask = uint8_t(regMask & 0xFFu);
    combinedOpFlags |= opFlags;
  }

  // Decrease the number of operands of those that are none. This is important as Assembler and Compiler may just pass
  // more operands padded with none (which means that no operand is given at that index). However, validate that there
  // are no gaps (like [reg, none, reg] or [none, reg]).
  if (i < opCount) {
    while (--opCount > i)
      if (ASMJIT_UNLIKELY(!operands[opCount].isNone()))
        return DebugUtils::errored(kErrorInvalidInstruction);
  }

  // Validate X86 and X64 specific cases.
  if (mode == InstDB::Mode::kX86) {
    // Illegal use of 64-bit register in 32-bit mode.
    if (ASMJIT_UNLIKELY(Support::test(combinedOpFlags, InstDB::OpFlags::kRegGpq)))
      return DebugUtils::errored(kErrorInvalidUseOfGpq);
  }
  else {
    // Illegal use of a high 8-bit register with REX prefix.
    bool hasREX = inst.hasOption(InstOptions::kX86_Rex) || (combinedRegMask & 0xFFFFFF00u) != 0;
    if (ASMJIT_UNLIKELY(hasREX && Support::test(combinedOpFlags, InstDB::OpFlags::kRegGpbHi)))
      return DebugUtils::errored(kErrorInvalidUseOfGpbHi);
  }

  // Validate Instruction Signature by Comparing Against All `iSig` Rows
  // -------------------------------------------------------------------

  const InstDB::InstSignature* iSig = InstDB::_instSignatureTable + commonInfo._iSignatureIndex;
  const InstDB::InstSignature* iEnd = iSig + commonInfo._iSignatureCount;

  if (iSig != iEnd) {
    const InstDB::OpSignature* opSignatureTable = InstDB::_opSignatureTable;

    // If set it means that we matched a signature where only immediate value
    // was out of bounds. We can return a more descriptive error if we know this.
    bool globalImmOutOfRange = false;

    do {
      // Check if the architecture is compatible.
      if (!iSig->supportsMode(mode))
        continue;

      // Compare the operands table with reference operands.
      uint32_t j = 0;
      uint32_t iSigCount = iSig->opCount();
      bool localImmOutOfRange = false;

      if (iSigCount == opCount) {
        for (j = 0; j < opCount; j++)
          if (!x86CheckOSig(oSigTranslated[j], iSig->opSignature(j), localImmOutOfRange))
            break;
      }
      else if (iSigCount - iSig->implicitOpCount() == opCount) {
        uint32_t r = 0;
        for (j = 0; j < opCount && r < iSigCount; j++, r++) {
          const InstDB::OpSignature* oChk = oSigTranslated + j;
          const InstDB::OpSignature* oRef;
Next:
          oRef = opSignatureTable + iSig->opSignatureIndex(r);
          // Skip implicit operands.
          if (oRef->isImplicit()) {
            if (++r >= iSigCount)
              break;
            else
              goto Next;
          }

          if (!x86CheckOSig(*oChk, *oRef, localImmOutOfRange))
            break;
        }
      }

      if (j == opCount) {
        if (!localImmOutOfRange) {
          // Match, must clear possible `globalImmOutOfRange`.
          globalImmOutOfRange = false;
          break;
        }
        globalImmOutOfRange = localImmOutOfRange;
      }
    } while (++iSig != iEnd);

    if (iSig == iEnd) {
      if (globalImmOutOfRange)
        return DebugUtils::errored(kErrorInvalidImmediate);
      else
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate AVX512 Options
  // -----------------------

  const RegOnly& extraReg = inst.extraReg();

  if (Support::test(options, kAvx512Options)) {
    if (commonInfo.hasFlag(InstDB::InstFlags::kEvex)) {
      // Validate AVX-512 {z}.
      if (Support::test(options, InstOptions::kX86_ZMask)) {
        if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_ZMask) && !commonInfo.hasAvx512Z()))
          return DebugUtils::errored(kErrorInvalidKZeroUse);
      }

      // Validate AVX-512 {sae} and {er}.
      if (Support::test(options, InstOptions::kX86_SAE | InstOptions::kX86_ER)) {
        // Rounding control is impossible if the instruction is not reg-to-reg.
        if (ASMJIT_UNLIKELY(memOp))
          return DebugUtils::errored(kErrorInvalidEROrSAE);

        // Check if {sae} or {er} is supported by the instruction.
        if (Support::test(options, InstOptions::kX86_ER)) {
          // NOTE: if both {sae} and {er} are set, we don't care, as {sae} is implied.
          if (ASMJIT_UNLIKELY(!commonInfo.hasAvx512ER()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
        else {
          if (ASMJIT_UNLIKELY(!commonInfo.hasAvx512SAE()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }

        // {sae} and {er} are defined for either scalar ops or vector ops that require LL to be 10 (512-bit vector
        // operations). We don't need any more bits in the instruction database to be able to validate this, as
        // each AVX512 instruction that has broadcast is vector instruction (in this case we require zmm registers),
        // otherwise it's a scalar instruction, which is valid.
        if (commonInfo.hasAvx512B()) {
          // Supports broadcast, thus we require LL to be '10', which means there have to be ZMM registers used. We
          // don't calculate LL here, but we know that it would be '10' if there is at least one ZMM register used.

          // There is no {er}/{sae}-enabled instruction with less than two operands.
          ASMJIT_ASSERT(opCount >= 2);
          if (ASMJIT_UNLIKELY(!x86IsZmmOrM512(operands[0]) && !x86IsZmmOrM512(operands[1])))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
      }
    }
    else {
      // Not an AVX512 instruction - maybe OpExtra is xCX register used by REP/REPNE prefix.
      if (Support::test(options, kAvx512Options) || !Support::test(options, kRepAny))
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate {Extra} Register
  // -------------------------

  if (extraReg.isReg()) {
    if (Support::test(options, kRepAny)) {
      // Validate REP|REPNE {cx|ecx|rcx}.
      if (ASMJIT_UNLIKELY(Support::test(iFlags, InstDB::InstFlags::kRepIgnored)))
        return DebugUtils::errored(kErrorInvalidExtraReg);

      if (extraReg.isPhysReg()) {
        if (ASMJIT_UNLIKELY(extraReg.id() != Gp::kIdCx))
          return DebugUtils::errored(kErrorInvalidExtraReg);
      }

      // The type of the {...} register must match the type of the base register
      // of memory operand. So if the memory operand uses 32-bit register the
      // count register must also be 32-bit, etc...
      if (ASMJIT_UNLIKELY(!memOp || extraReg.type() != memOp->baseType()))
        return DebugUtils::errored(kErrorInvalidExtraReg);
    }
    else if (commonInfo.hasFlag(InstDB::InstFlags::kEvex)) {
      // Validate AVX-512 {k}.
      if (ASMJIT_UNLIKELY(extraReg.type() != RegType::kX86_KReg))
        return DebugUtils::errored(kErrorInvalidExtraReg);

      if (ASMJIT_UNLIKELY(extraReg.id() == 0 || !commonInfo.hasAvx512K()))
        return DebugUtils::errored(kErrorInvalidKMaskUse);
    }
    else {
      return DebugUtils::errored(kErrorInvalidExtraReg);
    }
  }

  return kErrorOk;
}